

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O0

void __thiscall
icu_63::TimeZoneFormat::appendOffsetDigits
          (TimeZoneFormat *this,UnicodeString *buf,int32_t n,uint8_t minDigits)

{
  int iVar1;
  int local_28;
  int32_t i;
  int32_t numDigits;
  uint8_t minDigits_local;
  int32_t n_local;
  UnicodeString *buf_local;
  TimeZoneFormat *this_local;
  
  iVar1 = 1;
  if (9 < n) {
    iVar1 = 2;
  }
  for (local_28 = 0; local_28 < (int)((uint)minDigits - iVar1); local_28 = local_28 + 1) {
    UnicodeString::append(buf,this->fGMTOffsetDigits[0]);
  }
  if (iVar1 == 2) {
    UnicodeString::append(buf,this->fGMTOffsetDigits[n / 10]);
  }
  UnicodeString::append(buf,this->fGMTOffsetDigits[n % 10]);
  return;
}

Assistant:

void
TimeZoneFormat::appendOffsetDigits(UnicodeString& buf, int32_t n, uint8_t minDigits) const {
    U_ASSERT(n >= 0 && n < 60);
    int32_t numDigits = n >= 10 ? 2 : 1;
    for (int32_t i = 0; i < minDigits - numDigits; i++) {
        buf.append(fGMTOffsetDigits[0]);
    }
    if (numDigits == 2) {
        buf.append(fGMTOffsetDigits[n / 10]);
    }
    buf.append(fGMTOffsetDigits[n % 10]);
}